

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void de::cmdline::detail::dispatchSetDefault<tcu::opt::LogFilename>(TypedFieldMap *dst)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst_00;
  ValueType *value;
  TypedFieldMap *dst_local;
  
  dst_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)dst_00);
  getTypeDefault<std::__cxx11::string>(dst_00);
  TypedFieldMap::set<tcu::opt::LogFilename>(dst,dst_00);
  return;
}

Assistant:

void dispatchSetDefault (TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		getTypeDefault<typename OptTraits<OptType>::ValueType>(value);
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}